

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

void google::protobuf::compiler::ruby::GenerateOneof(OneofDescriptor *oneof,Printer *printer)

{
  long lVar1;
  
  io::Printer::Print(printer,"oneof :$name$ do\n","name",*(string **)oneof);
  io::Printer::Indent(printer);
  if (0 < *(int *)(oneof + 0x1c)) {
    lVar1 = 0;
    do {
      GenerateField(*(FieldDescriptor **)(*(long *)(oneof + 0x20) + lVar1 * 8),printer);
      lVar1 = lVar1 + 1;
    } while (lVar1 < *(int *)(oneof + 0x1c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"end\n");
  return;
}

Assistant:

void GenerateOneof(const google::protobuf::OneofDescriptor* oneof,
                   google::protobuf::io::Printer* printer) {
  printer->Print(
      "oneof :$name$ do\n",
      "name", oneof->name());
  printer->Indent();

  for (int i = 0; i < oneof->field_count(); i++) {
    const FieldDescriptor* field = oneof->field(i);
    GenerateField(field, printer);
  }

  printer->Outdent();
  printer->Print("end\n");
}